

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall FMapInfoParser::ParseDamageDefinition(FMapInfoParser *this)

{
  bool bVar1;
  FName local_2c;
  undefined1 local_28 [8];
  DamageTypeDefinition dtd;
  FName damageType;
  FMapInfoParser *this_local;
  
  FScanner::MustGetString(&this->sc);
  FName::FName((FName *)&dtd.field_0xc,(this->sc).String);
  DamageTypeDefinition::DamageTypeDefinition((DamageTypeDefinition *)local_28);
  ParseOpenBrace(this);
  while (FScanner::MustGetAnyToken(&this->sc), (this->sc).TokenType != 0x7d) {
    bVar1 = FScanner::Compare(&this->sc,"FACTOR");
    if (bVar1) {
      FScanner::MustGetStringName(&this->sc,"=");
      FScanner::MustGetFloat(&this->sc);
      local_28 = (undefined1  [8])(this->sc).Float;
      if (((double)local_28 == 0.0) && (!NAN((double)local_28))) {
        dtd.DefaultFactor._0_1_ = 1;
      }
    }
    else {
      bVar1 = FScanner::Compare(&this->sc,"REPLACEFACTOR");
      if (bVar1) {
        dtd.DefaultFactor._0_1_ = 1;
      }
      else {
        bVar1 = FScanner::Compare(&this->sc,"NOARMOR");
        if (bVar1) {
          dtd.DefaultFactor._1_1_ = 1;
        }
        else {
          FScanner::ScriptError
                    (&this->sc,"Unexpected data (%s) in damagetype definition.",(this->sc).String);
        }
      }
    }
  }
  FName::FName(&local_2c,(FName *)&dtd.field_0xc);
  DamageTypeDefinition::Apply((DamageTypeDefinition *)local_28,&local_2c);
  return;
}

Assistant:

void FMapInfoParser::ParseDamageDefinition()
{
	sc.MustGetString();
	FName damageType = sc.String;

	DamageTypeDefinition dtd;

	ParseOpenBrace();
	while (sc.MustGetAnyToken(), sc.TokenType != '}')
	{
		if (sc.Compare("FACTOR"))
		{
			sc.MustGetStringName("=");
			sc.MustGetFloat();
			dtd.DefaultFactor = sc.Float;
			if (dtd.DefaultFactor == 0) dtd.ReplaceFactor = true;
		}
		else if (sc.Compare("REPLACEFACTOR"))
		{
			dtd.ReplaceFactor = true;
		}
		else if (sc.Compare("NOARMOR"))
		{
			dtd.NoArmor = true;
		}
		else
		{
			sc.ScriptError("Unexpected data (%s) in damagetype definition.", sc.String);
		}
	}

	dtd.Apply(damageType);
}